

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

uint pugi::impl::anon_unknown_0::hash_string(char_t *str)

{
  uint uVar1;
  
  uVar1 = 0;
  for (; *str != 0; str = str + 1) {
    uVar1 = (uVar1 + *str) * 0x401;
    uVar1 = uVar1 >> 6 ^ uVar1;
  }
  return (uVar1 * 9 >> 0xb ^ uVar1 * 9) * 0x8001;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW unsigned int hash_string(const char_t* str)
	{
		// Jenkins one-at-a-time hash (http://en.wikipedia.org/wiki/Jenkins_hash_function#one-at-a-time)
		unsigned int result = 0;

		while (*str)
		{
			result += static_cast<unsigned int>(*str++);
			result += result << 10;
			result ^= result >> 6;
		}

		result += result << 3;
		result ^= result >> 11;
		result += result << 15;

		return result;
	}